

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O3

void __thiscall
netlist::InstanceVisitor::handleInstanceMemberPorts(InstanceVisitor *this,InstanceSymbol *symbol)

{
  InstanceBodySymbol *pIVar1;
  NetlistPortDeclaration *port;
  Symbol *member;
  Symbol *symbol_00;
  
  pIVar1 = symbol->body;
  if ((pIVar1->super_Scope).deferredMemberIndex != Invalid) {
    slang::ast::Scope::elaborate(&pIVar1->super_Scope);
  }
  for (symbol_00 = (pIVar1->super_Scope).firstMember; symbol_00 != (Symbol *)0x0;
      symbol_00 = symbol_00->nextInScope) {
    if (symbol_00->kind == Port) {
      port = Netlist::addPortDeclaration(this->netlist,symbol_00);
      connectPortInternal(this,&port->super_NetlistNode);
    }
  }
  return;
}

Assistant:

auto handleInstanceMemberPorts(ast::InstanceSymbol const& symbol) {

        for (auto& member : symbol.body.members()) {
            if (member.kind == ast::SymbolKind::Port) {
                // Create the port declaration netlist node and connect it to
                // the corresponding local variable declaration.
                auto& portNode = netlist.addPortDeclaration(member);
                connectPortInternal(portNode);
            }
        }
    }